

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O1

int __thiscall MobileElementManager::Choose(MobileElementManager *this)

{
  int __val;
  long *plVar1;
  runtime_error *prVar2;
  long *plVar3;
  string err;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_38,vsnprintf,0x148,"%f",SUB84(this->prop_sum_,0));
    std::operator+(&local_58,"There are no active polymerases on polymer (propensity sum: ",
                   &local_38);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_58);
    local_78 = (long *)*plVar1;
    plVar3 = plVar1 + 2;
    if (local_78 == plVar3) {
      local_68 = *plVar3;
      lStack_60 = plVar1[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar3;
    }
    local_70 = plVar1[1];
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,(string *)&local_78);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __val = Random::
          WeightedChoiceIndex<std::pair<std::shared_ptr<MobileElement>,std::shared_ptr<Polymer>>>
                    (&this->polymerases_,&this->prop_list_);
  if ((ulong)(long)__val <
      (ulong)((long)(this->polymerases_).
                    super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->polymerases_).
                    super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    if ((ulong)(long)__val <
        (ulong)((long)(this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_start >> 3)) {
      return __val;
    }
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Prop list vector index is invalid (before move).");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::to_string(&local_38,__val);
  std::operator+(&local_58,"Attempting to move unbound polymerase with index ",&local_38);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_58);
  local_78 = (long *)*plVar1;
  plVar3 = plVar1 + 2;
  if (local_78 == plVar3) {
    local_68 = *plVar3;
    lStack_60 = plVar1[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar3;
  }
  local_70 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,(string *)&local_78);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int MobileElementManager::Choose() {
  /*for (int i = 0; i < prop_list_.size(); i++) {
    std::cout << i << " :" << prop_list_[i] << std::endl;
  }*/
  if (prop_list_.size() == 0) {
    std::string err =
        "There are no active polymerases on polymer (propensity sum: " +
        std::to_string(prop_sum_) + ").";
    throw std::runtime_error(err);
  }
  int pol_index = Random::WeightedChoiceIndex(polymerases_, prop_list_);
  // std::cout << "chosen index :" << pol_index << std::endl;
  // Error checking to make sure that pol is in vector
  if (pol_index >= polymerases_.size()) {
    std::string err = "Attempting to move unbound polymerase with index " +
                      std::to_string(pol_index) + " on polymer.";
    throw std::runtime_error(err);
  }
  if (pol_index >= prop_list_.size()) {
    throw std::runtime_error(
        "Prop list vector index is invalid (before move).");
  }
  return pol_index;
}